

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O3

void __thiscall HDual::major_updateFtranFinal(HDual *this)

{
  uint uVar1;
  int iVar2;
  HVector *this_00;
  HVector *this_01;
  HVector_ptr pHVar3;
  HVector_ptr pHVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  HModel *pHVar8;
  undefined8 uVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  ulong uVar12;
  undefined4 uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  
  uVar9 = rdtsc();
  uVar13 = (undefined4)((ulong)uVar9 >> 0x20);
  auVar10._4_4_ = uVar13;
  auVar10._0_4_ = uVar13;
  auVar10._8_4_ = 0;
  auVar20._0_12_ = auVar10 << 0x20;
  auVar20._12_4_ = 0x45300000;
  (this->model->timer).itemStart[0x14] =
       (auVar20._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
  uVar1 = this->multi_nFinish;
  uVar12 = (ulong)uVar1;
  if ((this->dualRHS).workCount < 0) {
    if (0 < (int)uVar1) {
      uVar15 = 0;
      do {
        pHVar3 = this->multi_finish[uVar15].column;
        pHVar3->count = -1;
        pHVar4 = this->multi_finish[uVar15].row_ep;
        pHVar4->count = -1;
        if (uVar15 != 0) {
          pdVar5 = (pHVar3->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (pHVar4->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar1 = this->numRow;
          uVar16 = 0;
          do {
            iVar2 = this->multi_finish[uVar16].rowOut;
            dVar22 = this->multi_finish[uVar16].alphaRow;
            pdVar7 = ((this->multi_finish[uVar16].column)->array).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar23 = pdVar6[iVar2];
            if (1e-14 < ABS(pdVar5[iVar2])) {
              dVar24 = pdVar5[iVar2] / dVar22;
              if (0 < (int)uVar1) {
                uVar19 = 0;
                do {
                  pdVar5[uVar19] = pdVar7[uVar19] * -dVar24 + pdVar5[uVar19];
                  uVar19 = uVar19 + 1;
                } while (uVar1 != uVar19);
              }
              pdVar5[iVar2] = dVar24;
            }
            if (1e-14 < ABS(dVar23)) {
              dVar23 = dVar23 / dVar22;
              if (0 < (int)uVar1) {
                uVar19 = 0;
                do {
                  pdVar6[uVar19] = pdVar7[uVar19] * -dVar23 + pdVar6[uVar19];
                  uVar19 = uVar19 + 1;
                } while (uVar1 != uVar19);
              }
              pdVar6[iVar2] = dVar23;
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar12);
    }
  }
  else if (0 < (int)uVar1) {
    lVar18 = 0;
    lVar14 = 0;
    do {
      if (lVar14 != 0) {
        this_00 = this->multi_finish[lVar14].row_ep;
        this_01 = this->multi_finish[lVar14].column;
        lVar17 = 0;
        do {
          iVar2 = *(int *)((long)&this->multi_finish[0].rowOut + lVar17);
          dVar22 = (this_01->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2];
          if (1e-14 < ABS(dVar22)) {
            dVar22 = dVar22 / *(double *)((long)&this->multi_finish[0].alphaRow + lVar17);
            HVector::saxpy(this_01,-dVar22,
                           *(HVector **)((long)&this->multi_finish[0].column + lVar17));
            (this_01->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2] = dVar22;
          }
          dVar22 = (this_00->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2];
          if (1e-14 < ABS(dVar22)) {
            dVar22 = dVar22 / *(double *)((long)&this->multi_finish[0].alphaRow + lVar17);
            HVector::saxpy(this_00,-dVar22,
                           *(HVector **)((long)&this->multi_finish[0].column + lVar17));
            (this_00->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2] = dVar22;
          }
          lVar17 = lVar17 + 0x78;
        } while (lVar18 != lVar17);
        uVar12 = (ulong)(uint)this->multi_nFinish;
      }
      lVar14 = lVar14 + 1;
      lVar18 = lVar18 + 0x78;
    } while (lVar14 < (int)uVar12);
  }
  pHVar8 = this->model;
  uVar9 = rdtsc();
  uVar13 = (undefined4)((ulong)uVar9 >> 0x20);
  auVar11._4_4_ = uVar13;
  auVar11._0_4_ = uVar13;
  auVar11._8_4_ = 0;
  auVar21._0_12_ = auVar11 << 0x20;
  auVar21._12_4_ = 0x45300000;
  (pHVar8->timer).itemTicks[0x14] =
       (((auVar21._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) -
       (pHVar8->timer).itemStart[0x14]) + (pHVar8->timer).itemTicks[0x14];
  return;
}

Assistant:

void HDual::major_updateFtranFinal() {
    model->timer.recordStart(HTICK_FTRAN_MIX);
    int updateFTRAN_inDense = dualRHS.workCount < 0;
    if (updateFTRAN_inDense) {
        for (int iFn = 0; iFn < multi_nFinish; iFn++) {
            multi_finish[iFn].column->count = -1;
            multi_finish[iFn].row_ep->count = -1;
            double *myCol = &multi_finish[iFn].column->array[0];
            double *myRow = &multi_finish[iFn].row_ep->array[0];
            for (int jFn = 0; jFn < iFn; jFn++) {
                int pivotRow = multi_finish[jFn].rowOut;
                const double pivotAlpha = multi_finish[jFn].alphaRow;
                const double *pivotArray = &multi_finish[jFn].column->array[0];
                double pivotX1 = myCol[pivotRow];
                double pivotX2 = myRow[pivotRow];

                // The FTRAN regular buffer
                if (fabs(pivotX1) > HSOL_CONST_TINY) {
                    const double pivot = pivotX1 / pivotAlpha;
#pragma omp parallel for
                    for (int i = 0; i < numRow; i++)
                        myCol[i] -= pivot * pivotArray[i];
                    myCol[pivotRow] = pivot;
                }
                // The FTRAN-DSE buffer
                if (fabs(pivotX2) > HSOL_CONST_TINY) {
                    const double pivot = pivotX2 / pivotAlpha;
#pragma omp parallel for
                    for (int i = 0; i < numRow; i++)
                        myRow[i] -= pivot * pivotArray[i];
                    myRow[pivotRow] = pivot;
                }
            }
        }
    } else {
        for (int iFn = 0; iFn < multi_nFinish; iFn++) {
            MFinish *Fin = &multi_finish[iFn];
            HVector *Col = Fin->column;
            HVector *Row = Fin->row_ep;
            for (int jFn = 0; jFn < iFn; jFn++) {
                MFinish *jFinish = &multi_finish[jFn];
                int pivotRow = jFinish->rowOut;
                double pivotX1 = Col->array[pivotRow];
                // The FTRAN regular buffer
                if (fabs(pivotX1) > HSOL_CONST_TINY) {
                    pivotX1 /= jFinish->alphaRow;
                    Col->saxpy(-pivotX1, jFinish->column);
                    Col->array[pivotRow] = pivotX1;
                }
                // The FTRAN-DSE buffer
                double pivotX2 = Row->array[pivotRow];
                if (fabs(pivotX2) > HSOL_CONST_TINY) {
                    pivotX2 /= jFinish->alphaRow;
                    Row->saxpy(-pivotX2, jFinish->column);
                    Row->array[pivotRow] = pivotX2;
                }
            }
        }
    }
    model->timer.recordFinish(HTICK_FTRAN_MIX);
}